

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O2

void __thiscall YacclabTests::~YacclabTests(YacclabTests *this)

{
  int iVar1;
  Labeling *pLVar2;
  undefined4 extraout_var;
  
  pLVar2 = LabelingMapSingleton::GetLabeling
                     ((this->mode_cfg_->ccl_existing_algorithms).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  iVar1 = (*pLVar2->_vptr_Labeling[9])(pLVar2);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            ((undefined8 *)CONCAT44(extraout_var,iVar1));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
  ::~_Rb_tree(&(this->memory_accesses_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
  ::~_Rb_tree(&(this->average_ws_results_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
  ::~_Rb_tree(&(this->granularity_results_)._M_t);
  cv::Mat::~Mat(&(this->density_results_).super_Mat);
  cv::Mat::~Mat(&(this->average_results_).super_Mat);
  std::__cxx11::string::~string((string *)&this->output_path);
  OutputBox::~OutputBox(&this->ob_);
  return;
}

Assistant:

~YacclabTests() {
        LabelingMapSingleton::GetLabeling(mode_cfg_.ccl_existing_algorithms[0])->GetInput()->Release();
    }